

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls_scache.c
# Opt level: O0

CURLcode cf_ssl_peer_key_add_hash(dynbuf *buf,char *name,curl_blob *blob)

{
  CURLcode CVar1;
  ulong local_50;
  size_t i;
  uchar hash [32];
  CURLcode r;
  curl_blob *blob_local;
  char *name_local;
  dynbuf *buf_local;
  
  hash[0x1c] = '\0';
  hash[0x1d] = '\0';
  hash[0x1e] = '\0';
  hash[0x1f] = '\0';
  if ((((blob != (curl_blob *)0x0) && (blob->len != 0)) &&
      (hash._28_4_ = Curl_dyn_addf(buf,":%s-",name), hash._28_4_ == CURLE_OK)) &&
     (hash._28_4_ = Curl_sha256it((uchar *)&i,(uchar *)blob->data,blob->len),
     hash._28_4_ == CURLE_OK)) {
    local_50 = 0;
    while ((local_50 < 0x20 &&
           (hash._28_4_ = Curl_dyn_addf(buf,"%02x",(ulong)hash[local_50 - 8]),
           hash._28_4_ == CURLE_OK))) {
      local_50 = local_50 + 1;
    }
  }
  CVar1._0_1_ = hash[0x1c];
  CVar1._1_1_ = hash[0x1d];
  CVar1._2_1_ = hash[0x1e];
  CVar1._3_1_ = hash[0x1f];
  return CVar1;
}

Assistant:

static CURLcode cf_ssl_peer_key_add_hash(struct dynbuf *buf,
                                          const char *name,
                                          struct curl_blob *blob)
{
  CURLcode r = CURLE_OK;
  if(blob && blob->len) {
    unsigned char hash[CURL_SHA256_DIGEST_LENGTH];
    size_t i;

    r = Curl_dyn_addf(buf, ":%s-", name);
    if(r)
      goto out;
    r = Curl_sha256it(hash, blob->data, blob->len);
    if(r)
      goto out;
    for(i = 0; i < CURL_SHA256_DIGEST_LENGTH; ++i) {
      r = Curl_dyn_addf(buf, "%02x", hash[i]);
      if(r)
        goto out;
    }
  }
out:
  return r;
}